

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall
iu_MatcherFailure_x_iutest_x_Optional_Test::Body(iu_MatcherFailure_x_iutest_x_Optional_Test *this)

{
  TestFlag TVar1;
  TestPartResultReporterInterface *pTVar2;
  undefined7 uVar3;
  undefined1 uVar4;
  TestFlag *pTVar5;
  Variable *pVVar6;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  size_type __dnew;
  TestFlag local_43c;
  AssertionResult local_438;
  AssertionResult local_410;
  detail *local_3e8;
  long local_3d8 [2];
  string local_3c8;
  AssertionHelper local_3a8;
  SPIFailureChecker local_378;
  undefined1 local_340 [8];
  int *local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [32];
  char *local_198;
  undefined8 local_190;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_338 = (int *)local_1b8;
  local_1b8._0_4_ = 1;
  local_340 = (undefined1  [8])&PTR__OptionalMatcher_0023f7d8;
  local_330._M_allocated_capacity._0_7_ = SUB87(local_320,0);
  uVar3 = local_330._M_allocated_capacity._0_7_;
  local_330._M_local_buf[7] = (char)((ulong)local_320 >> 0x38);
  uVar4 = local_330._M_local_buf[7];
  local_330._8_7_ = 0;
  local_330._M_local_buf[0xf] = '\0';
  local_320[0]._M_local_buf[0] = '\0';
  iutest::detail::OptionalMatcher<int>::operator()
            (&local_410,(OptionalMatcher<int> *)local_340,&optempty);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT17(local_330._M_local_buf[7],local_330._M_allocated_capacity._0_7_) != local_320) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT17(local_330._M_local_buf[7],local_330._M_allocated_capacity._0_7_),
                    CONCAT71(local_320[0]._M_allocated_capacity._1_7_,local_320[0]._M_local_buf[0])
                    + 1);
  }
  if (local_410.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    iutest::detail::iuUniversalPrinter<std::optional<int>_>::Print
              (&optempty,(iu_ostream *)&local_330);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3c8,local_3e8,"Optional(1)",(char *)&local_410,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3c8._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x35e;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (local_3e8 != (detail *)local_3d8) {
      operator_delete(local_3e8,local_3d8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_message._M_dataplus._M_p != &local_410.m_message.field_2) {
    operator_delete(local_410.m_message._M_dataplus._M_p,
                    local_410.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar1.m_test_flags = local_43c.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar1.m_test_flags;
  local_1b8._0_8_ = (int *)0x22;
  local_340 = (undefined1  [8])&local_330;
  local_340 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_1b8);
  local_330._M_allocated_capacity._0_7_ = (undefined7)local_1b8._0_8_;
  local_330._M_local_buf[7] = SUB81(local_1b8._0_8_,7);
  *(undefined8 *)((long)local_340 + 0x10) = 0x6f6e207369206863;
  *(undefined8 *)((long)local_340 + 0x18) = 0x656761676e652074;
  *(undefined8 *)local_340 = 0x6c616e6f6974704f;
  *(undefined8 *)((long)local_340 + 8) = 0x696877282031203a;
  *(undefined2 *)((long)local_340 + 0x20) = 0x2964;
  local_338 = (int *)local_1b8._0_8_;
  *(char *)((long)local_340 + local_1b8._0_8_) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_438,&local_378,(string *)local_340);
  if (local_340 != (undefined1  [8])&local_330) {
    operator_delete((void *)local_340,
                    CONCAT17(local_330._M_local_buf[7],local_330._M_allocated_capacity._0_7_) + 1);
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar2 = local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar2;
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_438.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x10000035e;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_1b8._0_4_ = 2;
  local_340 = (undefined1  [8])&PTR__OptionalMatcher_0023f7d8;
  local_330._8_7_ = 0;
  local_330._M_local_buf[0xf] = '\0';
  local_320[0]._M_local_buf[0] = '\0';
  local_338 = (int *)local_1b8;
  local_330._M_allocated_capacity._0_7_ = uVar3;
  local_330._M_local_buf[7] = uVar4;
  iutest::detail::OptionalMatcher<int>::operator()
            (&local_410,(OptionalMatcher<int> *)local_340,&opt1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT17(local_330._M_local_buf[7],local_330._M_allocated_capacity._0_7_) != local_320) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT17(local_330._M_local_buf[7],local_330._M_allocated_capacity._0_7_),
                    CONCAT71(local_320[0]._M_allocated_capacity._1_7_,local_320[0]._M_local_buf[0])
                    + 1);
  }
  if (local_410.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    iutest::detail::iuUniversalPrinter<std::optional<int>_>::Print(&opt1,(iu_ostream *)&local_330);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3c8,local_3e8,"Optional(2)",(char *)&local_410,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3c8._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x35f;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (local_3e8 != (detail *)local_3d8) {
      operator_delete(local_3e8,local_3d8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_message._M_dataplus._M_p != &local_410.m_message.field_2) {
    operator_delete(local_410.m_message._M_dataplus._M_p,
                    local_410.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = local_43c.m_test_flags;
  local_330._M_allocated_capacity._0_7_ = 0x616e6f6974704f;
  local_330._M_local_buf[7] = 'l';
  local_330._8_7_ = 0x2931282032203a;
  local_338 = (int *)0xf;
  local_330._M_local_buf[0xf] = '\0';
  local_340 = (undefined1  [8])&local_330;
  iutest::detail::SPIFailureChecker::GetResult(&local_438,&local_378,(string *)local_340);
  if (local_340 != (undefined1  [8])&local_330) {
    operator_delete((void *)local_340,
                    CONCAT17(local_330._M_local_buf[7],local_330._M_allocated_capacity._0_7_) + 1);
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter =
       local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_438.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x10000035f;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, Optional)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(optempty, Optional(1)), "Optional: 1 (which is not engaged)");
    CHECK_FAILURE( IUTEST_ASSERT_THAT(opt1, Optional(2)), "Optional: 2 (1)");
}